

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::internal::ArgFormatterBase<fmt::ArgFormatter<char>,_char>::visit_bool
          (ArgFormatterBase<fmt::ArgFormatter<char>,_char> *this,bool value)

{
  FormatSpec *spec;
  StringValue<char> local_18;
  undefined8 local_8;
  
  spec = this->spec_;
  if (spec->type_ == '\0') {
    local_18.value = "false";
    if (value) {
      local_18.value = "true";
    }
    local_18.size = (ulong)value ^ 5;
    BasicWriter<char>::write_str<char>(this->writer_,&local_18,spec);
  }
  else {
    local_8._0_4_ = spec->precision_;
    local_8._4_1_ = spec->type_;
    local_8._5_3_ = *(undefined3 *)&spec->field_0x15;
    local_18.value = *(char **)&(spec->super_AlignSpec).super_WidthSpec;
    local_18.size = *(size_t *)&(spec->super_AlignSpec).align_;
    BasicWriter<char>::write_int<bool,fmt::FormatSpec>(this->writer_,value,*spec);
  }
  return;
}

Assistant:

void visit_bool(bool value) {
    if (spec_.type_)
      return visit_any_int(value);
    write(value);
  }